

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cpp
# Opt level: O2

int xercesc_4_0::RegularExpression::getOptionValue(XMLCh ch)

{
  undefined2 in_register_0000003a;
  int iVar1;
  
  iVar1 = CONCAT22(in_register_0000003a,ch);
  if (iVar1 == 0x46) {
    return 0x100;
  }
  if (iVar1 != 0x48) {
    if (iVar1 == 0x58) {
      return 0x200;
    }
    if (iVar1 == 0x78) {
      iVar1 = 0x10;
    }
    else if (iVar1 == 0x6d) {
      iVar1 = 8;
    }
    else if (iVar1 == 0x73) {
      iVar1 = 4;
    }
    else {
      if (iVar1 != 0x69) {
        return 0;
      }
      iVar1 = 2;
    }
    return iVar1;
  }
  return 0x80;
}

Assistant:

int RegularExpression::getOptionValue(const XMLCh ch) {

    int ret = 0;

    switch (ch) {

        case chLatin_i:
            ret = IGNORE_CASE;
            break;
        case chLatin_m:
            ret = MULTIPLE_LINE;
            break;
        case chLatin_s:
            ret = SINGLE_LINE;
            break;
        case chLatin_x:
            ret = EXTENDED_COMMENT;
            break;
        case chLatin_F:
            ret = PROHIBIT_FIXED_STRING_OPTIMIZATION;
            break;
        case chLatin_H:
            ret = PROHIBIT_HEAD_CHARACTER_OPTIMIZATION;
            break;
        case chLatin_X:
            ret = XMLSCHEMA_MODE;
            break;
        default:
            break;
    }

    return ret;
}